

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

uint ImGui::RoundScalarWithFormatT<unsigned_int>(char *format,ImGuiDataType data_type,uint v)

{
  char *pcVar1;
  char cVar2;
  char *in_RAX;
  char *pcVar3;
  int iVar4;
  double dVar5;
  char v_str [64];
  char fmt_sanitized [32];
  undefined8 uStack_80;
  char local_78 [64];
  char local_38 [40];
  
  if ((data_type & 0xfffffffeU) != 8) {
    uStack_80 = ScaleRatioFromValueT<long_long,long_long,double>;
    __assert_fail("data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_widgets.cpp"
                  ,0x845,
                  "TYPE ImGui::RoundScalarWithFormatT(const char *, ImGuiDataType, TYPE) [TYPE = unsigned int]"
                 );
  }
  do {
    cVar2 = *format;
    if (cVar2 == '\0') {
      iVar4 = 3;
      pcVar3 = in_RAX;
    }
    else if ((cVar2 != '%') || (iVar4 = 1, pcVar3 = format, format[1] == '%')) {
      format = format + (ulong)(cVar2 == '%') + 1;
      iVar4 = 0;
      pcVar3 = in_RAX;
    }
    in_RAX = pcVar3;
  } while (iVar4 == 0);
  if (iVar4 == 1) {
    format = pcVar3;
  }
  if ((*format == '%') && (format[1] != '%')) {
    uStack_80 = (code *)0x1949cf;
    ImParseFormatSanitizeForPrinting(format,local_38,0x20);
    uStack_80 = (code *)0x1949e3;
    ImFormatString(local_78,0x40,local_38,(ulong)v);
    pcVar3 = (char *)((long)&uStack_80 + 7);
    do {
      pcVar1 = pcVar3 + 1;
      pcVar3 = pcVar3 + 1;
    } while (*pcVar1 == ' ');
    uStack_80 = (code *)0x1949f7;
    dVar5 = atof(pcVar3);
    v = (uint)(long)dVar5;
  }
  return v;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    IM_UNUSED(data_type);
    IM_ASSERT(data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    ImParseFormatSanitizeForPrinting(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    v = (TYPE)ImAtof(p);

    return v;
}